

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fftlib.c
# Opt level: O3

void frstage(float *ioptr,long M,float *Utbl)

{
  float *pfVar1;
  undefined8 uVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  long lVar12;
  long lVar13;
  ulong uVar14;
  long lVar15;
  ulong uVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  
  lVar12 = 1;
  uVar16 = 1L << ((ulong)((int)M - 1) & 0x3f);
  pfVar1 = ioptr + (uVar16 >> 1);
  lVar13 = 1L << ((ulong)((int)M - 3) & 0x3f);
  fVar3 = *ioptr + *ioptr;
  fVar4 = ioptr[1] + ioptr[1];
  fVar5 = pfVar1[uVar16] + *pfVar1;
  fVar9 = pfVar1[1] - pfVar1[uVar16 + 1];
  fVar7 = (pfVar1[uVar16 + 1] + pfVar1[1]) * Utbl[lVar13];
  fVar8 = (pfVar1[uVar16] - *pfVar1) * Utbl[lVar13];
  fVar6 = fVar8 + fVar5 + fVar7;
  auVar21 = vfmsub132ss_fma(ZEXT416((uint)fVar5),ZEXT416((uint)fVar6),ZEXT416(0x40000000));
  fVar8 = (fVar9 - fVar7) + fVar8;
  uVar2 = *(undefined8 *)(ioptr + uVar16);
  auVar10 = vfmadd132ss_fma(ZEXT416((uint)fVar9),ZEXT416((uint)fVar8),ZEXT416(0xc0000000));
  *ioptr = fVar4 + fVar3;
  ioptr[1] = fVar3 - fVar4;
  auVar19._0_4_ = (float)uVar2 * 2.0;
  auVar19._4_4_ = (float)((ulong)uVar2 >> 0x20) * -2.0;
  auVar19._8_8_ = 0;
  uVar2 = vmovlps_avx(auVar19);
  *(undefined8 *)(ioptr + uVar16) = uVar2;
  *pfVar1 = fVar6;
  pfVar1[1] = fVar8;
  pfVar1[uVar16] = auVar21._0_4_;
  pfVar1[uVar16 + 1] = auVar10._0_4_;
  if (lVar13 != 1) {
    fVar3 = Utbl[1];
    uVar14 = -1L << ((ulong)(byte)((char)M - 2) & 0x3f);
    fVar4 = Utbl[~uVar14];
    lVar15 = uVar14 * -4;
    do {
      fVar5 = *(float *)((long)ioptr + lVar15 * 2 + uVar16 * 4 + -8);
      fVar6 = *(float *)((long)ioptr + lVar15 * 2 + uVar16 * 4 + -4);
      fVar8 = *(float *)((long)ioptr + lVar15 * 2 + -8);
      fVar7 = *(float *)((long)ioptr + lVar15 * 2 + -4);
      fVar9 = ioptr[uVar16 + lVar12 * 2];
      auVar19 = ZEXT416((uint)(fVar5 - ioptr[lVar12 * 2]));
      auVar25 = ZEXT416((uint)(fVar5 + ioptr[lVar12 * 2]));
      auVar10 = vfmadd213ss_fma(ZEXT416((uint)fVar4),auVar19,auVar25);
      auVar18 = ZEXT416((uint)fVar3);
      auVar21 = ZEXT416((uint)(fVar6 + ioptr[lVar12 * 2 + 1]));
      auVar10 = vfmadd231ss_fma(auVar10,auVar21,auVar18);
      auVar26 = ZEXT416((uint)(ioptr[lVar12 * 2 + 1] - fVar6));
      auVar21 = vfmsub213ss_fma(auVar21,ZEXT416((uint)fVar4),auVar26);
      auVar11 = vfmsub231ss_fma(auVar21,auVar18,auVar19);
      auVar22 = ZEXT416((uint)(fVar7 - ioptr[uVar16 + lVar12 * 2 + 1]));
      auVar24 = ZEXT416((uint)(ioptr[uVar16 + lVar12 * 2 + 1] + fVar7));
      auVar21 = vfmsub213ss_fma(auVar18,auVar24,auVar22);
      auVar17 = SUB6416(ZEXT464(0x40000000),0);
      auVar19 = vfmsub213ss_fma(auVar25,auVar17,auVar10);
      ioptr[lVar12 * 2] = auVar10._0_4_;
      auVar20 = ZEXT416((uint)(fVar9 + fVar8));
      auVar23 = ZEXT416((uint)(fVar9 - fVar8));
      auVar10 = vfmadd213ss_fma(auVar18,auVar23,auVar20);
      auVar25 = vfnmadd213ss_fma(auVar26,auVar17,auVar11);
      auVar18 = vfmsub231ss_fma(auVar21,auVar23,ZEXT416((uint)fVar4));
      ioptr[lVar12 * 2 + 1] = auVar11._0_4_;
      *(int *)((long)ioptr + lVar15 * 2 + uVar16 * 4 + -8) = auVar19._0_4_;
      auVar10 = vfmadd231ss_fma(auVar10,auVar24,ZEXT416((uint)fVar4));
      *(int *)((long)ioptr + lVar15 * 2 + uVar16 * 4 + -4) = auVar25._0_4_;
      auVar19 = vfnmadd213ss_fma(auVar22,auVar17,auVar18);
      fVar3 = Utbl[lVar12 + 1];
      fVar4 = *(float *)((long)Utbl + lVar15 + -8);
      auVar21 = vfmsub213ss_fma(auVar20,auVar17,auVar10);
      *(int *)((long)ioptr + lVar15 * 2 + -8) = auVar10._0_4_;
      *(int *)((long)ioptr + lVar15 * 2 + -4) = auVar18._0_4_;
      lVar15 = lVar15 + -4;
      ioptr[uVar16 + lVar12 * 2] = auVar21._0_4_;
      ioptr[uVar16 + lVar12 * 2 + 1] = auVar19._0_4_;
      lVar12 = lVar12 + 1;
    } while (lVar13 != lVar12);
  }
  return;
}

Assistant:

static inline void frstage(float *ioptr, long M, float *Utbl){
/*	Finish RFFT		*/

unsigned long 	pos;
unsigned long 	posi;
unsigned long 	diffUcnt;

float 	*p0r, *p1r;
float 	*u0r, *u0i;

float w0r, w0i;
float f0r, f0i, f1r, f1i, f4r, f4i, f5r, f5i;
float t0r, t0i, t1r, t1i;
const float Two = 2.0;

pos = POW2(M-1);
posi = pos + 1;

p0r = ioptr;
p1r = ioptr + pos/2;

u0r = Utbl + POW2(M-3);

w0r =  *u0r,

f0r = *(p0r);
f0i = *(p0r + 1);
f4r = *(p0r + pos);
f4i = *(p0r + posi);
f1r = *(p1r);
f1i = *(p1r + 1);
f5r = *(p1r + pos);
f5i = *(p1r + posi);

	t0r = Two * f0r + Two * f0i;    /* compute Re(x[0]) */
	t0i = Two * f0r - Two * f0i;    /* compute Re(x[N/2]) */
	t1r = f4r + f4r;
	t1i = -f4i - f4i;

	f0r = f1r + f5r;
	f0i = f1i - f5i;
	f4r = f1i + f5i;
	f4i = f5r - f1r;

	f1r = f0r + w0r * f4r + w0r * f4i;
	f1i = f0i - w0r * f4r + w0r * f4i;
	f5r = Two * f0r - f1r;
	f5i = f1i - Two * f0i;

*(p0r) = t0r;
*(p0r + 1) = t0i;
*(p0r + pos) = t1r;
*(p0r + posi) = t1i;
*(p1r) = f1r;
*(p1r + 1) = f1i;
*(p1r + pos) = f5r;
*(p1r + posi) = f5i;

u0r = Utbl + 1;
u0i = Utbl + (POW2(M-2)-1);

w0r =  *u0r,
w0i =  *u0i;
	
p0r = (ioptr + 2);
p1r = (ioptr + (POW2(M-2)-1)*2);

				/* Butterflys */
				/*
		f0	-	t0	-	-	f0
		f5	-	t1	- w0	-	f5

		f1	-	t0	-	-	f1
		f4	-	t1	-iw0 -	f4
				*/

for (diffUcnt = POW2(M-3)-1; diffUcnt > 0 ; diffUcnt--){

	f0r = *(p0r);
	f0i = *(p0r + 1);
	f5r = *(p1r + pos);
	f5i = *(p1r + posi);
	f1r = *(p1r);
	f1i = *(p1r + 1);
	f4r = *(p0r + pos);
	f4i = *(p0r + posi);

	t0r = f0r + f5r;
	t0i = f0i - f5i;
	t1r = f0i + f5i;
	t1i = f5r - f0r;

	f0r = t0r + w0r * t1r + w0i * t1i;
	f0i = t0i - w0i * t1r + w0r * t1i;
	f5r = Two * t0r - f0r;
	f5i = f0i - Two * t0i;

	t0r = f1r + f4r;
	t0i = f1i - f4i;
	t1r = f1i + f4i;
	t1i = f4r - f1r;

	f1r = t0r + w0i * t1r + w0r * t1i;
	f1i = t0i - w0r * t1r + w0i * t1i;
	f4r = Two * t0r - f1r;
	f4i = f1i - Two * t0i;

	*(p0r) = f0r;
	*(p0r + 1) = f0i;
	*(p1r + pos) = f5r;
	*(p1r + posi) = f5i;

	w0r = *++u0r;
	w0i = *--u0i;

	*(p1r) = f1r;
	*(p1r + 1) = f1i;
	*(p0r + pos) = f4r;
	*(p0r + posi) = f4i;

	p0r += 2;
	p1r -= 2;
};
}